

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

bool __thiscall
crnlib::task_pool::queue_task(task_pool *this,task_callback_func pFunc,uint64 data,void *pData_ptr)

{
  int iVar1;
  long lVar2;
  
  LOCK();
  this->m_total_submitted_tasks = this->m_total_submitted_tasks + 1;
  UNLOCK();
  spinlock::lock((spinlock *)this);
  iVar1 = (this->m_task_stack).m_top;
  lVar2 = (long)iVar1;
  if (lVar2 < 0x10) {
    (this->m_task_stack).m_top = iVar1 + 1;
    (this->m_task_stack).m_stack[lVar2].m_data = data;
    (this->m_task_stack).m_stack[lVar2].m_pData_ptr = pData_ptr;
    (this->m_task_stack).m_stack[lVar2].field_2.m_callback = pFunc;
    (this->m_task_stack).m_stack[lVar2].m_flags = 0;
    spinlock::unlock((spinlock *)this);
    semaphore::release(&this->m_tasks_available,1);
  }
  else {
    spinlock::unlock((spinlock *)this);
    LOCK();
    this->m_total_completed_tasks = this->m_total_completed_tasks + 1;
    UNLOCK();
  }
  return iVar1 < 0x10;
}

Assistant:

bool task_pool::queue_task(task_callback_func pFunc, uint64 data, void* pData_ptr)
    {
        CRNLIB_ASSERT(pFunc);

        task tsk;
        tsk.m_callback = pFunc;
        tsk.m_data = data;
        tsk.m_pData_ptr = pData_ptr;
        tsk.m_flags = 0;

        atomic_increment32(&m_total_submitted_tasks);
        if (!m_task_stack.try_push(tsk))
        {
            atomic_increment32(&m_total_completed_tasks);
            return false;
        }

        m_tasks_available.release(1);

        return true;
    }